

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

boundaries *
nlohmann::detail::dtoa_impl::compute_boundaries<double>
          (boundaries *__return_storage_ptr__,double value)

{
  uint uVar1;
  diyfp *pdVar2;
  ulong uVar3;
  diyfp *this;
  uint uVar4;
  bool bVar5;
  diyfp dVar6;
  diyfp dVar7;
  diyfp dVar8;
  diyfp local_40;
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dinopony[P]randstalker/extlibs/landstalker_lib/landstalker-lib/tools/json.hpp"
                  ,0x3c91,
                  "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
                 );
  }
  if (0.0 < value) {
    pdVar2 = (diyfp *)((ulong)value & 0xfffffffffffff);
    uVar1 = (uint)((ulong)value >> 0x20);
    bVar5 = (ulong)value >> 0x34 == 0;
    this = (diyfp *)((ulong)pdVar2 | 0x10000000000000);
    if (bVar5) {
      this = pdVar2;
    }
    uVar4 = 0xfffffbce;
    if (!bVar5) {
      uVar4 = (uVar1 >> 0x14) - 0x433;
    }
    bVar5 = (ulong)value >> 0x35 == 0;
    dVar6.f = (ulong)(uVar4 - 1);
    uVar3 = (ulong)((uVar1 >> 0x14) - 0x435);
    if (bVar5 || pdVar2 != (diyfp *)0x0) {
      uVar3 = dVar6.f;
    }
    local_40.f = 0x3fffffffffffff;
    if (bVar5 || pdVar2 != (diyfp *)0x0) {
      local_40.f = (long)this * 2 - 1;
    }
    local_40.e = (int)uVar3;
    dVar6._8_8_ = uVar3;
    dVar6 = diyfp::normalize((diyfp *)((long)this * 2 + 1),dVar6);
    dVar7 = diyfp::normalize_to(&local_40,dVar6.e);
    dVar8._8_8_ = dVar7._8_8_;
    dVar8.f = (ulong)uVar4;
    dVar8 = diyfp::normalize(this,dVar8);
    (__return_storage_ptr__->w).f = dVar8.f;
    (__return_storage_ptr__->w).e = dVar8.e;
    (__return_storage_ptr__->minus).f = dVar7.f;
    (__return_storage_ptr__->minus).e = dVar7.e;
    (__return_storage_ptr__->plus).f = dVar6.f;
    (__return_storage_ptr__->plus).e = dVar6.e;
    return __return_storage_ptr__;
  }
  __assert_fail("value > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Dinopony[P]randstalker/extlibs/landstalker_lib/landstalker-lib/tools/json.hpp"
                ,0x3c92,
                "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
               );
}

Assistant:

boundaries compute_boundaries(FloatType value)
{
    JSON_ASSERT(std::isfinite(value));
    JSON_ASSERT(value > 0);

    // Convert the IEEE representation into a diyfp.
    //
    // If v is denormal:
    //      value = 0.F * 2^(1 - bias) = (          F) * 2^(1 - bias - (p-1))
    // If v is normalized:
    //      value = 1.F * 2^(E - bias) = (2^(p-1) + F) * 2^(E - bias - (p-1))

    static_assert(std::numeric_limits<FloatType>::is_iec559,
                  "internal error: dtoa_short requires an IEEE-754 floating-point implementation");

    constexpr int      kPrecision = std::numeric_limits<FloatType>::digits; // = p (includes the hidden bit)
    constexpr int      kBias      = std::numeric_limits<FloatType>::max_exponent - 1 + (kPrecision - 1);
    constexpr int      kMinExp    = 1 - kBias;
    constexpr std::uint64_t kHiddenBit = std::uint64_t{1} << (kPrecision - 1); // = 2^(p-1)

    using bits_type = typename std::conditional<kPrecision == 24, std::uint32_t, std::uint64_t >::type;

    const auto bits = static_cast<std::uint64_t>(reinterpret_bits<bits_type>(value));
    const std::uint64_t E = bits >> (kPrecision - 1);
    const std::uint64_t F = bits & (kHiddenBit - 1);

    const bool is_denormal = E == 0;
    const diyfp v = is_denormal
                    ? diyfp(F, kMinExp)
                    : diyfp(F + kHiddenBit, static_cast<int>(E) - kBias);

    // Compute the boundaries m- and m+ of the floating-point value
    // v = f * 2^e.
    //
    // Determine v- and v+, the floating-point predecessor and successor if v,
    // respectively.
    //
    //      v- = v - 2^e        if f != 2^(p-1) or e == e_min                (A)
    //         = v - 2^(e-1)    if f == 2^(p-1) and e > e_min                (B)
    //
    //      v+ = v + 2^e
    //
    // Let m- = (v- + v) / 2 and m+ = (v + v+) / 2. All real numbers _strictly_
    // between m- and m+ round to v, regardless of how the input rounding
    // algorithm breaks ties.
    //
    //      ---+-------------+-------------+-------------+-------------+---  (A)
    //         v-            m-            v             m+            v+
    //
    //      -----------------+------+------+-------------+-------------+---  (B)
    //                       v-     m-     v             m+            v+

    const bool lower_boundary_is_closer = F == 0 && E > 1;
    const diyfp m_plus = diyfp(2 * v.f + 1, v.e - 1);
    const diyfp m_minus = lower_boundary_is_closer
                          ? diyfp(4 * v.f - 1, v.e - 2)  // (B)
                          : diyfp(2 * v.f - 1, v.e - 1); // (A)

    // Determine the normalized w+ = m+.
    const diyfp w_plus = diyfp::normalize(m_plus);

    // Determine w- = m- such that e_(w-) = e_(w+).
    const diyfp w_minus = diyfp::normalize_to(m_minus, w_plus.e);

    return {diyfp::normalize(v), w_minus, w_plus};
}